

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::ExpressionsAssignment1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsAssignment1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  allocator<char> local_192;
  allocator<char> local_191;
  string base_variable_string;
  string shader_source;
  string local_150;
  string local_130 [32];
  string local_110;
  string local_f0 [32];
  string local_d0;
  string local_b0 [32];
  string local_90;
  string prefix;
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prefix,"(",(allocator<char> *)&base_variable_string);
  base_variable_string._M_dataplus._M_p = (pointer)&base_variable_string.field_2;
  base_variable_string._M_string_length = 0;
  base_variable_string.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"    float x",&local_191);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"[2]",&local_192);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_f0,local_50,2);
  std::__cxx11::string::append((string *)&base_variable_string);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::append((char *)&base_variable_string);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"float",&local_191);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"4.0, 6.0",&local_192);
  recursively_initialise(&shader_source,this,&local_110,2,&local_90);
  std::__cxx11::string::append((string *)&base_variable_string);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::append((char *)&base_variable_string);
  std::__cxx11::string::string<std::allocator<char>>(local_130,"    float y",&local_191);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"[2]",&local_192);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_130,local_b0,2);
  std::__cxx11::string::append((string *)&base_variable_string);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::append((char *)&base_variable_string);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"float",&local_191);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"1.0, 2.0",&local_192);
  recursively_initialise(&shader_source,this,&local_150,2,&local_d0);
  std::__cxx11::string::append((string *)&base_variable_string);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::append((char *)&base_variable_string);
  std::operator+(&shader_source,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 shader_start_abi_cxx11_,&base_variable_string);
  std::__cxx11::string::append((char *)&shader_source);
  if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xabf);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  switch((ulong)tested_shader_type) {
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 4:
  case 3:
    std::__cxx11::string::append((string *)&shader_source);
  }
  std::__cxx11::string::append((string *)&shader_source);
  (*(code *)(&DAT_01722178 + *(int *)(&DAT_01722178 + (ulong)tested_shader_type * 4)))();
  return;
}

Assistant:

void ExpressionsAssignment1<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	for (size_t max_dimension_index = 2; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string prefix = "(";
		std::string base_variable_string;

		base_variable_string += this->extend_string("    float x", "[2]", max_dimension_index);
		base_variable_string += " = ";
		base_variable_string += recursively_initialise("float", max_dimension_index, "4.0, 6.0");
		base_variable_string += ";\n";
		base_variable_string += this->extend_string("    float y", "[2]", max_dimension_index);
		base_variable_string += " = ";
		base_variable_string += recursively_initialise("float", max_dimension_index, "1.0, 2.0");
		base_variable_string += ";\n\n";

		std::string shader_source = shader_start + base_variable_string;

		shader_source += "    x = y;\n";

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 2; ...) */
}